

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

bool check_protection(GlobalVars *gv,char *name)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  SymNames *sn;
  undefined8 *local_20;
  
  local_20 = *(undefined8 **)(in_RDI + 0xc0);
  while( true ) {
    if (local_20 == (undefined8 *)0x0) {
      return 0;
    }
    iVar1 = strcmp((char *)local_20[1],in_RSI);
    if (iVar1 == 0) break;
    local_20 = (undefined8 *)*local_20;
  }
  return 1;
}

Assistant:

bool check_protection(struct GlobalVars *gv,const char *name)
/* checks if symbol name is protected against stripping */
{
  struct SymNames *sn = gv->prot_syms;

  while (sn) {
    if (!strcmp(sn->name,name))
      return TRUE;
    sn = sn->next;
  }
  return FALSE;
}